

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ForkBranch<unsigned_int>::get(ForkBranch<unsigned_int> *this,ExceptionOrValue *output)

{
  ExceptionOrValue *pEVar1;
  
  pEVar1 = ((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (pEVar1[1].exception.ptr.isSet == true) {
    *(undefined4 *)&output[1].exception.ptr.field_0x4 =
         *(undefined4 *)&pEVar1[1].exception.ptr.field_0x4;
    output[1].exception.ptr.isSet = true;
  }
  else if (output[1].exception.ptr.isSet == true) {
    output[1].exception.ptr.isSet = false;
  }
  if (pEVar1 != output) {
    if ((output->exception).ptr.isSet == true) {
      (output->exception).ptr.isSet = false;
      Exception::~Exception(&(output->exception).ptr.field_1.value);
    }
    if ((pEVar1->exception).ptr.isSet == true) {
      Exception::Exception
                (&(output->exception).ptr.field_1.value,&(pEVar1->exception).ptr.field_1.value);
      (output->exception).ptr.isSet = true;
    }
  }
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(*value);
    } else {
      output.as<T>().value = nullptr;
    }